

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FloatToBuffer(float value,char *buffer)

{
  bool bVar1;
  uint uVar2;
  LogMessage *pLVar3;
  double dVar4;
  double dVar5;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  float local_7c;
  LogFinisher local_75;
  float parsed_value;
  byte local_61;
  LogMessage local_60;
  int local_24;
  char *pcStack_20;
  int snprintf_result;
  char *buffer_local;
  char *pcStack_10;
  float value_local;
  
  pcStack_20 = buffer;
  buffer_local._4_4_ = value;
  dVar4 = std::numeric_limits<double>::infinity();
  if (((double)value != dVar4) || (NAN((double)value) || NAN(dVar4))) {
    dVar4 = (double)buffer_local._4_4_;
    dVar5 = std::numeric_limits<double>::infinity();
    if ((dVar4 != -dVar5) || (NAN(dVar4) || NAN(-dVar5))) {
      uVar2 = std::isnan((double)(ulong)(uint)buffer_local._4_4_);
      if ((uVar2 & 1) == 0) {
        local_24 = snprintf(pcStack_20,0x18,"%.*g",(double)buffer_local._4_4_,6);
        local_61 = 0;
        if ((local_24 < 1) || (0x17 < local_24)) {
          internal::LogMessage::LogMessage
                    (&local_60,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                     ,0x567);
          local_61 = 1;
          pLVar3 = internal::LogMessage::operator<<
                             (&local_60,
                              "CHECK failed: snprintf_result > 0 && snprintf_result < kFloatToBufferSize: "
                             );
          internal::LogFinisher::operator=(&local_75,pLVar3);
        }
        if ((local_61 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_60);
        }
        bVar1 = safe_strtof(pcStack_20,&local_7c);
        if (((!bVar1) || (local_7c != buffer_local._4_4_)) ||
           (NAN(local_7c) || NAN(buffer_local._4_4_))) {
          local_24 = snprintf(pcStack_20,0x18,"%.*g",(double)buffer_local._4_4_,9);
          local_b9 = 0;
          if ((local_24 < 1) || (0x17 < local_24)) {
            internal::LogMessage::LogMessage
                      (&local_b8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                       ,0x56f);
            local_b9 = 1;
            pLVar3 = internal::LogMessage::operator<<
                               (&local_b8,
                                "CHECK failed: snprintf_result > 0 && snprintf_result < kFloatToBufferSize: "
                               );
            internal::LogFinisher::operator=(&local_ba,pLVar3);
          }
          if ((local_b9 & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_b8);
          }
        }
        DelocalizeRadix(pcStack_20);
        pcStack_10 = pcStack_20;
      }
      else {
        strcpy(pcStack_20,"nan");
        pcStack_10 = pcStack_20;
      }
    }
    else {
      strcpy(pcStack_20,"-inf");
      pcStack_10 = pcStack_20;
    }
  }
  else {
    strcpy(pcStack_20,"inf");
    pcStack_10 = pcStack_20;
  }
  return pcStack_10;
}

Assistant:

char* FloatToBuffer(float value, char* buffer) {
  // FLT_DIG is 6 for IEEE-754 floats, which are used on almost all
  // platforms these days.  Just in case some system exists where FLT_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  static_assert(FLT_DIG < 10, "FLT_DIG_is_too_big");

  if (value == std::numeric_limits<double>::infinity()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -std::numeric_limits<double>::infinity()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (std::isnan(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result =
    snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);

  float parsed_value;
  if (!safe_strtof(buffer, &parsed_value) || parsed_value != value) {
    snprintf_result =
        snprintf(buffer, kFloatToBufferSize, "%.*g", FLT_DIG + 3, value);

    // Should never overflow; see above.
    GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}